

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::inertia::mark_bisection
          (inertia *this,CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> *axis)

{
  int *piVar1;
  CommPtr *pCVar2;
  Alloc *pAVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar4;
  Vector<3> center_00;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Alloc *pAVar9;
  Vector<3> *pVVar10;
  Reals *pRVar11;
  Alloc *this_01;
  int iVar12;
  Int j_2;
  undefined1 *puVar13;
  double *pdVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  int iVar16;
  void **ppvVar17;
  undefined8 uVar18;
  uint uVar19;
  undefined8 *puVar20;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Reals *a;
  long lVar22;
  undefined8 *puVar23;
  void **ppvVar24;
  SharedAlloc *pSVar25;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *p_Var27;
  long lVar28;
  Int i_1;
  long lVar29;
  Int i_2;
  long lVar30;
  Real *result;
  ulong uVar31;
  CommPtr *pCVar32;
  IntIterator last;
  size_t sVar33;
  byte bVar34;
  double dVar35;
  Library *pLVar36;
  Library *pLVar37;
  Library *pLVar38;
  _Base_ptr extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  double dVar39;
  Library *pLVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var43;
  double dVar44;
  Library *pLVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  bool bVar48;
  Library *pLVar49;
  Library *pLVar50;
  Library *pLVar51;
  Real i_8;
  Library *pLVar52;
  double dVar53;
  Library *pLVar54;
  double dVar55;
  double dVar56;
  ulong uVar57;
  Read<signed_char> RVar58;
  Vector<3> c_7;
  Vector<6> v;
  DiagDecomp<3> ed;
  Vector<3> c;
  Vector<3> c_9;
  Vector<3> n;
  Write<double> weighted_contrib;
  Vector<3> c_5;
  Vector<3> l;
  Vector<3> c_2;
  Vector<3> c_19;
  Vector<3> center;
  Vector<3> c_4;
  Library *local_548 [4];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  Library *local_508 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4f0;
  Library *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  Library *pLStack_4d8;
  Library *local_4d0;
  Library *local_4c8;
  _Base_ptr p_Stack_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b8;
  undefined1 auStack_4b0 [8];
  Library *local_4a8 [5];
  undefined4 uStack_480;
  undefined4 uStack_47c;
  Library *local_478;
  undefined1 local_470 [16];
  undefined8 local_460;
  Library *local_450;
  Read<signed_char> local_448;
  undefined8 uStack_438;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  Library *local_428;
  Library *pLStack_420;
  Library *local_418;
  Library *pLStack_410;
  Library *local_408;
  Library *local_3f8;
  Library *pLStack_3f0;
  Write<double> local_3e8;
  Library *local_3d8 [2];
  double local_3c8;
  Library *pLStack_3c0;
  Library *local_3b8;
  Alloc *local_3b0;
  void *local_3a8;
  Library *local_398;
  Library *pLStack_390;
  CommPtr *local_380;
  Library *local_378;
  void *pvStack_370;
  Library *local_368;
  Library *pLStack_360;
  double local_358;
  Library *local_350;
  Library *pLStack_348;
  Alloc *local_340;
  void *pvStack_338;
  Alloc *local_328;
  void *local_320;
  Library *local_318;
  void *local_310;
  Write<double> local_308;
  Library *local_2f8;
  void *pvStack_2f0;
  Library *local_2e8;
  Library *local_2d8;
  Library *pLStack_2d0;
  undefined8 local_2c8;
  Library *pLStack_2c0;
  undefined8 local_2b8;
  Library *pLStack_2b0;
  Library *local_2a8;
  Library *pLStack_2a0;
  Library *local_298;
  Library *pLStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  Library *local_268 [4];
  double local_248;
  Library *local_240;
  Library *local_238;
  Alloc *local_230;
  void *local_228;
  Alloc *local_220;
  Reals *local_218;
  Real local_210;
  Library *local_208;
  Library *pLStack_200;
  double local_1f8;
  double local_1e8;
  undefined8 uStack_1e0;
  Library *local_1d8;
  ulong uStack_1d0;
  Reals local_1c8;
  Reals local_1b8;
  Reals local_1a8;
  CommPtr local_198;
  Reals local_188;
  CommPtr local_178;
  Alloc *local_168;
  void *local_160;
  Library *local_158;
  void *local_150;
  Library *local_148;
  void *pvStack_140;
  Library *local_138;
  Library *local_128;
  void *pvStack_120;
  Library *local_118;
  Library *local_108;
  Library *pLStack_100;
  Library *local_f8;
  Library *pLStack_f0;
  Library *local_e8;
  Library *pLStack_e0;
  Real local_d0;
  Vector<3> *local_c8;
  Reals *local_c0;
  Alloc *local_b8;
  void *local_b0;
  Reals local_a8;
  double local_98 [3];
  Vector<3> local_80;
  double local_68 [4];
  Library *local_48 [3];
  void *pvVar21;
  
  bVar34 = 0;
  pAVar3 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar57 = pAVar3->size;
  }
  else {
    uVar57 = (ulong)pAVar3 >> 3;
  }
  local_188.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_188.write_.shared_alloc_.alloc & 1) == 0) {
    sVar33 = (local_188.write_.shared_alloc_.alloc)->size;
  }
  else {
    sVar33 = (ulong)local_188.write_.shared_alloc_.alloc >> 3;
  }
  if ((int)(sVar33 >> 3) * 3 != (int)(uVar57 >> 3)) {
    fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
         ,0x91);
  }
  local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      local_188.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
    }
    else {
      (local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188.write_.shared_alloc_.alloc =
           (Alloc *)((local_188.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_188.write_.shared_alloc_.alloc)->use_count =
           (local_188.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_188.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
  local_d0 = tolerance;
  local_210 = repro_sum(&local_178,&local_188);
  pAVar3 = local_188.write_.shared_alloc_.alloc;
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1a8.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1a8.write_.shared_alloc_.alloc)->use_count =
           (local_1a8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar3 = local_1a8.write_.shared_alloc_.alloc;
  local_1a8.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
  local_a8.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.write_.shared_alloc_.alloc)->use_count =
           (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar9 = local_a8.write_.shared_alloc_.alloc;
  local_a8.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
  local_380 = comm;
  anon_unknown_0::get_center(&local_80,&local_198,&local_1a8,&local_a8,local_210);
  if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
    piVar1 = &pAVar9->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar9);
      operator_delete(pAVar9,0x48);
    }
  }
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    piVar1 = &pAVar3->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  pCVar32 = local_380;
  if (local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pLVar36 = (Library *)
            (pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_318 = (Library *)(coords->write_).shared_alloc_.alloc;
  if (((ulong)local_318 & 7) == 0 && local_318 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_318 = (Library *)(*(size_t *)&local_318->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_318->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_318->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  pvVar21 = (coords->write_).shared_alloc_.direct_ptr;
  local_328 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_328 & 7) == 0 && local_328 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_328 = (Alloc *)(local_328->size * 8 + 1);
    }
    else {
      local_328->use_count = local_328->use_count + 1;
    }
  }
  pvVar4 = (masses->write_).shared_alloc_.direct_ptr;
  local_208 = (Library *)local_80.super_Few<double,_3>.array_[0];
  pLStack_200 = (Library *)local_80.super_Few<double,_3>.array_[1];
  local_1f8 = local_80.super_Few<double,_3>.array_[2];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_158 = local_318;
  if (((ulong)local_318 & 7) == 0 && local_318 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Library *)(*(size_t *)&local_318->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_318->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_318->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  pLVar50 = local_158;
  local_168 = local_328;
  if (((ulong)local_328 & 7) == 0 && local_328 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (Alloc *)(local_328->size * 8 + 1);
    }
    else {
      local_328->use_count = local_328->use_count + 1;
    }
  }
  pAVar3 = local_168;
  if (((ulong)local_168 & 1) == 0) {
    sVar33 = local_168->size;
  }
  else {
    sVar33 = (ulong)local_168 >> 3;
  }
  local_528._8_8_ = (Library *)0x0;
  local_518._0_8_ = local_518._0_8_ & 0xffffffffffffff00;
  iVar16 = (int)(sVar33 >> 3);
  local_528._0_8_ = (Library *)local_518;
  local_320 = pvVar4;
  local_310 = pvVar21;
  local_220 = (Alloc *)this;
  local_218 = coords;
  local_160 = pvVar4;
  local_150 = pvVar21;
  local_c8 = axis;
  local_c0 = masses;
  Write<double>::Write(&local_308,iVar16 * 6,(string *)local_528);
  if ((Library *)local_528._0_8_ != (Library *)local_518) {
    operator_delete((void *)local_528._0_8_,(ulong)(local_518._0_8_ + 1));
  }
  pRVar11 = local_c0;
  local_268[0] = pLVar50;
  if (((ulong)pLVar50 & 7) == 0 && pLVar50 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_268[0] = (Library *)(*(size_t *)&pLVar50->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(pLVar50->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(pLVar50->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
    }
  }
  local_268[1] = (Library *)pvVar21;
  local_268[2] = local_208;
  local_268[3] = pLStack_200;
  local_248 = local_1f8;
  local_240 = (Library *)local_308.shared_alloc_.alloc;
  if (((ulong)local_308.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_308.shared_alloc_.alloc != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_240 = (Library *)((local_308.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&(((CommPtr *)&(local_308.shared_alloc_.alloc)->use_count)->
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((CommPtr *)&(local_308.shared_alloc_.alloc)->use_count)->
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
    }
  }
  local_238 = (Library *)local_308.shared_alloc_.direct_ptr;
  local_230 = pAVar3;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_230 = (Alloc *)(pAVar3->size * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
  }
  local_228 = pvVar4;
  local_378 = local_268[0];
  if (((ulong)local_268[0] & 7) == 0 && local_268[0] != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_378 = (Library *)(*(size_t *)&local_268[0]->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_268[0]->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_268[0]->self_).
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_368 = local_208;
  pLStack_360 = pLStack_200;
  local_358 = local_1f8;
  local_350 = local_240;
  if (((ulong)local_240 & 7) == 0 && local_240 != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_350 = (Library *)(*(long *)&local_240->self_send_threshold_ * 8 + 1);
    }
    else {
      *(int *)&(local_240->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_240->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 1;
    }
  }
  pLStack_348 = (Library *)local_308.shared_alloc_.direct_ptr;
  local_340 = local_230;
  if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_340 = (Alloc *)(local_230->size * 8 + 1);
    }
    else {
      local_230->use_count = local_230->use_count + 1;
    }
  }
  pvStack_370 = pvVar21;
  pvStack_338 = pvVar4;
  if (0 < iVar16) {
    local_3e8.shared_alloc_.alloc = (Alloc *)local_378;
    local_3e8.shared_alloc_.direct_ptr = pvVar21;
    if (((ulong)local_378 & 7) == 0 && local_378 != (Library *)0x0) {
      *(int *)&(local_378->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_378->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + -1;
      local_3e8.shared_alloc_.alloc = (Alloc *)(*(size_t *)&local_378->self_send_threshold_ * 8 + 1)
      ;
    }
    local_378 = (Library *)0x0;
    pvStack_370 = (void *)0x0;
    local_3d8[0] = local_208;
    local_3d8[1] = pLStack_200;
    local_3c8 = local_1f8;
    pLStack_3c0 = local_350;
    local_3b8 = (Library *)local_308.shared_alloc_.direct_ptr;
    if (((ulong)local_350 & 7) == 0 && local_350 != (Library *)0x0) {
      *(int *)&(local_350->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(local_350->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + -1;
      pLStack_3c0 = (Library *)(*(long *)&local_350->self_send_threshold_ * 8 + 1);
    }
    local_350 = (Library *)0x0;
    pLStack_348 = (Library *)0x0;
    local_3b0 = local_340;
    local_3a8 = pvVar4;
    if (((ulong)local_340 & 7) == 0 && local_340 != (Alloc *)0x0) {
      local_340->use_count = local_340->use_count + -1;
      local_3b0 = (Alloc *)(local_340->size * 8 + 1);
    }
    local_340 = (Alloc *)0x0;
    pvStack_338 = (void *)0x0;
    entering_parallel = '\0';
    lVar22 = 0;
    do {
      puVar20 = (undefined8 *)((long)pvVar21 + lVar22 * 0x18);
      local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar20;
      local_4a8[0] = (Library *)*(undefined8 *)((long)pvVar21 + lVar22 * 0x18 + 0x10);
      auStack_4b0 = (undefined1  [8])puVar20[1];
      local_518._0_8_ = local_1f8;
      local_528._0_8_ = local_208;
      local_528._8_8_ = pLStack_200;
      lVar28 = 0;
      do {
        (&local_448.write_.shared_alloc_.alloc)[lVar28] =
             (Alloc *)(*(double *)(auStack_4b0 + lVar28 * 8 + -8) -
                      *(double *)(local_528 + lVar28 * 8));
        uVar42 = uStack_438._4_4_;
        uVar41 = (undefined4)uStack_438;
        local_508[2] = (Library *)local_448.write_.shared_alloc_.direct_ptr;
        local_508[1] = (Library *)local_448.write_.shared_alloc_.alloc;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      auVar5._8_4_ = (undefined4)uStack_438;
      auVar5._0_8_ = local_448.write_.shared_alloc_.direct_ptr;
      auVar5._12_4_ = uStack_438._4_4_;
      dVar35 = *(double *)((long)pvVar4 + lVar22 * 8);
      local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      register0x00001388 = (int)local_448.write_.shared_alloc_.direct_ptr;
      auStack_4b0 = (undefined1  [8])auVar5._8_8_;
      register0x0000138c =
           (uint)((ulong)local_448.write_.shared_alloc_.direct_ptr >> 0x20) ^ 0x80000000;
      local_4a8[1] = (Library *)
                     (CONCAT44(uStack_438._4_4_,(undefined4)uStack_438) ^ 0x8000000000000000);
      local_4a8[2] = (Library *)0x0;
      local_4a8[3] = (Library *)local_448.write_.shared_alloc_.alloc;
      local_4a8[4] = (Library *)local_448.write_.shared_alloc_.direct_ptr;
      _uStack_480 = (Library *)CONCAT44((int)local_448.write_.shared_alloc_.alloc,uStack_480);
      local_478 = (Library *)0x0;
      lVar28 = 0;
      do {
        local_68[2] = (double)*(undefined8 *)(auStack_4b0 + lVar28 * 0x18 + 8);
        local_68[0] = *(double *)(auStack_4b0 + lVar28 * 0x18 + -8);
        local_68[1] = (double)*(undefined8 *)(auStack_4b0 + lVar28 * 0x18);
        local_528._0_8_ = (Library *)0x0;
        local_518._0_8_ = (ulong)local_508[2] ^ 0x8000000000000000;
        local_518._8_8_ = CONCAT44(uVar42,uVar41) ^ 0x8000000000000000;
        local_508[0] = (Library *)0x0;
        _Stack_4f0._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((ulong)local_508[1] ^ 0x8000000000000000);
        local_4e8 = (Library *)0x0;
        local_548[2] = (Library *)local_518._0_8_;
        local_548[0] = (Library *)0x0;
        local_548[1] = pLStack_200;
        lVar29 = 0;
        do {
          (&local_148)[lVar29] = (Library *)((double)local_548[lVar29] * local_68[0]);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        lVar29 = 1;
        do {
          local_548[2] = (Library *)*(undefined8 *)(local_518 + lVar29 * 0x18);
          local_548[0] = *(Library **)(local_528 + lVar29 * 0x18);
          local_548[1] = (Library *)*(undefined8 *)(local_518 + lVar29 * 0x18 + -8);
          dVar39 = local_68[lVar29];
          lVar30 = 0;
          do {
            local_48[lVar30] = (Library *)((double)local_548[lVar30] * dVar39);
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
          local_548[2] = local_48[2];
          local_548[0] = local_48[0];
          local_548[1] = local_48[1];
          local_128 = local_148;
          pvStack_120 = pvStack_140;
          local_118 = local_138;
          lVar30 = 0;
          do {
            (&local_2f8)[lVar30] =
                 (Library *)((double)(&local_128)[lVar30] + (double)local_548[lVar30]);
            lVar30 = lVar30 + 1;
          } while (lVar30 != 3);
          local_148 = local_2f8;
          pvStack_140 = pvStack_2f0;
          local_138 = local_2e8;
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        *(Library **)((long)&local_448 + lVar28 * 0x18) = local_2f8;
        *(void **)((long)&local_448 + lVar28 * 0x18 + 8) = pvStack_2f0;
        (&uStack_438)[lVar28 * 3] = local_2e8;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        local_4a8[0] = (Library *)(&uStack_438)[lVar28 * 3];
        local_4b8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             *(_Base_ptr *)((long)&local_448 + lVar28 * 0x18);
        auStack_4b0 = (undefined1  [8])*(undefined8 *)((long)&local_448 + lVar28 * 0x18 + 8);
        lVar29 = 0;
        do {
          local_548[lVar29] = (Library *)(*(double *)(auStack_4b0 + lVar29 * 8 + -8) * -dVar35);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        *(Library **)(local_528 + lVar28 * 0x18) = local_548[0];
        *(Library **)(local_518 + lVar28 * 0x18 + -8) = local_548[1];
        *(Library **)(local_518 + lVar28 * 0x18) = local_548[2];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      *(undefined8 *)((LO *)local_308.shared_alloc_.direct_ptr + lVar22 * 0xc) = local_528._0_8_;
      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)((long)local_308.shared_alloc_.direct_ptr + 8))[lVar22 * 2].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_508[0];
      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)((long)local_308.shared_alloc_.direct_ptr + 8))[lVar22 * 2].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8;
      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)((long)local_308.shared_alloc_.direct_ptr + 8))[lVar22 * 2].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_518._8_8_;
      ((CommPtr *)((long)local_308.shared_alloc_.direct_ptr + 0x20))[lVar22 * 3].
      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_4f0._M_pi;
      ((CommPtr *)((long)local_308.shared_alloc_.direct_ptr + 0x20))[lVar22 * 3].
      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508[2];
      lVar22 = lVar22 + 1;
    } while ((int)lVar22 != iVar16);
    (anonymous_namespace)::
    get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
    ::$_0::~__0((__0 *)&local_3e8);
  }
  (anonymous_namespace)::
  get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)&local_378);
  auStack_4b0 = (undefined1  [8])this_00;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_3e8.shared_alloc_.alloc = local_308.shared_alloc_.alloc;
  if (((ulong)local_308.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_308.shared_alloc_.alloc != (Library *)0x0) {
    if (entering_parallel == '\x01') {
      local_3e8.shared_alloc_.alloc = (Alloc *)((local_308.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&(((CommPtr *)&(local_308.shared_alloc_.alloc)->use_count)->
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((CommPtr *)&(local_308.shared_alloc_.alloc)->use_count)->
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
    }
  }
  local_3e8.shared_alloc_.direct_ptr = local_308.shared_alloc_.direct_ptr;
  local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar36;
  Read<double>::Read(&local_448,&local_3e8);
  a = (Reals *)&local_448;
  result = (Real *)local_528;
  repro_sum((CommPtr *)&local_4b8,a,6,result);
  pAVar3 = local_448.write_.shared_alloc_.alloc;
  if (((ulong)local_448.write_.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_448.write_.shared_alloc_.alloc != (Library *)0x0) {
    pCVar32 = (CommPtr *)&(local_448.write_.shared_alloc_.alloc)->use_count;
    *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        0) {
      Alloc::~Alloc(local_448.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_3e8.shared_alloc_.alloc;
  if (((ulong)local_3e8.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_3e8.shared_alloc_.alloc != (Library *)0x0) {
    pCVar32 = (CommPtr *)&(local_3e8.shared_alloc_.alloc)->use_count;
    *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        0) {
      Alloc::~Alloc(local_3e8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (auStack_4b0 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4b0);
  }
  pLVar50 = local_508[1];
  pLVar36 = local_508[0];
  uVar7 = local_518._0_8_;
  uVar6 = local_528._8_8_;
  uVar18 = local_528._0_8_;
  local_4c8 = (Library *)local_518._8_8_;
  (anonymous_namespace)::
  get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)local_268);
  if (((ulong)local_308.shared_alloc_.alloc & 7) == 0 &&
      (Library *)local_308.shared_alloc_.alloc != (Library *)0x0) {
    pCVar32 = (CommPtr *)&(local_308.shared_alloc_.alloc)->use_count;
    *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        0) {
      Alloc::~Alloc(local_308.shared_alloc_.alloc);
      operator_delete(local_308.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_168;
  if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
    piVar1 = &local_168->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168);
      operator_delete(pAVar3,0x48);
    }
  }
  pLVar37 = local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Library *)0x0) {
    pCVar32 = &local_158->self_;
    *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        0) {
      Alloc::~Alloc((Alloc *)local_158);
      operator_delete(pLVar37,0x48);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pVVar10 = local_c8;
  pAVar3 = local_220;
  pCVar32 = local_380;
  local_528._0_8_ = uVar18;
  local_528._8_8_ = local_4c8;
  local_518._0_8_ = pLVar50;
  local_518._8_8_ = local_4c8;
  local_508[0] = (Library *)uVar6;
  local_508[1] = pLVar36;
  local_508[2] = pLVar50;
  _Stack_4f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar36;
  local_4e8 = (Library *)uVar7;
  dVar35 = 0.0;
  lVar22 = 0;
  do {
    lVar28 = 0;
    dVar39 = dVar35;
    do {
      dVar35 = ABS(result[lVar28]);
      if (ABS(result[lVar28]) <= dVar39) {
        dVar35 = dVar39;
      }
      lVar28 = lVar28 + 1;
      dVar39 = dVar35;
    } while (lVar28 != 3);
    lVar22 = lVar22 + 1;
    result = result + 3;
  } while (lVar22 != 3);
  if (dVar35 <= 1e-10) {
    puVar13 = auStack_4b0;
    lVar22 = 0;
    do {
      lVar28 = 0;
      auVar46 = _DAT_00443a30;
      do {
        bVar48 = SUB164(auVar46 ^ _DAT_00443a40,4) == -0x80000000 &&
                 SUB164(auVar46 ^ _DAT_00443a40,0) < -0x7ffffffd;
        if (bVar48) {
          uVar18 = 0x3ff0000000000000;
          if (lVar22 != lVar28) {
            uVar18 = 0;
          }
          *(undefined8 *)(puVar13 + lVar28 * 8 + -8) = uVar18;
        }
        if (bVar48) {
          uVar18 = 0x3ff0000000000000;
          if (lVar22 + -1 != lVar28) {
            uVar18 = 0;
          }
          *(undefined8 *)(puVar13 + lVar28 * 8) = uVar18;
        }
        lVar28 = lVar28 + 2;
        lVar29 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + 2;
        auVar46._8_8_ = lVar29 + 2;
      } while (lVar28 != 4);
      lVar22 = lVar22 + 1;
      puVar13 = puVar13 + 0x18;
    } while (lVar22 != 3);
    local_470 = (undefined1  [16])0x0;
    local_460 = 0;
  }
  else {
    lVar22 = 0;
    do {
      uStack_438._0_4_ = (undefined4)*(undefined8 *)(local_518 + lVar22 * 0x18);
      uStack_438._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_518 + lVar22 * 0x18) >> 0x20);
      local_448.write_.shared_alloc_.alloc = (Alloc *)*(Library **)(local_528 + lVar22 * 0x18);
      local_448.write_.shared_alloc_.direct_ptr = *(Library **)(local_518 + lVar22 * 0x18 + -8);
      lVar28 = 0;
      do {
        (&local_3e8.shared_alloc_.alloc)[lVar28] =
             (Alloc *)((double)(&local_448.write_.shared_alloc_.alloc)[lVar28] / dVar35);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      *(Alloc **)(auStack_4b0 + lVar22 * 0x18 + -8) = local_3e8.shared_alloc_.alloc;
      *(void **)(auStack_4b0 + lVar22 * 0x18) = local_3e8.shared_alloc_.direct_ptr;
      *(Library **)(auStack_4b0 + lVar22 * 0x18 + 8) = local_3d8[0];
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_528._8_8_ = auStack_4b0;
    local_518._0_8_ = local_4a8[0];
    lVar22 = 0;
    do {
      local_118 = *(Library **)(auStack_4b0 + lVar22 * 0x18 + 8);
      local_128 = *(Library **)(auStack_4b0 + lVar22 * 0x18 + -8);
      pvStack_120 = *(void **)(auStack_4b0 + lVar22 * 0x18);
      local_528._0_8_ = local_4b8._M_pi;
      local_518._8_8_ = local_4a8[1];
      local_508[0] = local_4a8[2];
      local_508[1] = local_4a8[3];
      local_508[2] = local_4a8[4];
      _Stack_4f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_uStack_480;
      local_4e8 = local_478;
      local_3d8[0] = (Library *)local_518._0_8_;
      local_3e8.shared_alloc_.alloc = (Alloc *)local_4b8._M_pi;
      local_3e8.shared_alloc_.direct_ptr = (void *)local_528._8_8_;
      lVar28 = 0;
      do {
        (&local_2f8)[lVar28] =
             (Library *)((double)(&local_3e8.shared_alloc_.alloc)[lVar28] * (double)local_128);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 1;
      do {
        local_3d8[0] = *(Library **)(local_518 + lVar28 * 0x18);
        local_3e8.shared_alloc_.alloc = *(Alloc **)(local_528 + lVar28 * 0x18);
        local_3e8.shared_alloc_.direct_ptr = *(void **)(local_518 + lVar28 * 0x18 + -8);
        pLVar36 = (&local_128)[lVar28];
        lVar29 = 0;
        do {
          local_548[lVar29] =
               (Library *)((double)(&local_3e8.shared_alloc_.alloc)[lVar29] * (double)pLVar36);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        local_3d8[0] = local_548[2];
        local_3e8.shared_alloc_.alloc = (Alloc *)local_548[0];
        local_3e8.shared_alloc_.direct_ptr = local_548[1];
        local_378 = local_2f8;
        pvStack_370 = pvStack_2f0;
        local_368 = local_2e8;
        lVar29 = 0;
        do {
          local_268[lVar29] =
               (Library *)
               ((double)(&local_378)[lVar29] + (double)(&local_3e8.shared_alloc_.alloc)[lVar29]);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        local_2f8 = local_268[0];
        pvStack_2f0 = local_268[1];
        local_2e8 = local_268[2];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      *(Library **)((long)&local_448 + lVar22 * 0x18) = local_268[0];
      *(Library **)((long)&local_448 + lVar22 * 0x18 + 8) = local_268[1];
      (&uStack_438)[lVar22 * 3] = local_268[2];
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    uStack_1e0 = 0;
    dVar53 = (double)local_4b8._M_pi + (double)local_4a8[2] + (double)local_478;
    dVar55 = dVar53 * dVar53;
    dVar39 = (dVar55 - ((double)local_448.write_.shared_alloc_.alloc + (double)local_428 +
                       (double)local_408)) * 0.5;
    dVar44 = ((dVar39 * 3.0 - dVar55) / 3.0) / 3.0;
    dVar56 = ((dVar55 * dVar53 + dVar55 * dVar53 +
              dVar39 * -9.0 * dVar53 +
              (((((double)local_528._8_8_ * (double)local_4a8[4] * (double)local_4a8[3] +
                 (double)local_4b8._M_pi * (double)local_4a8[2] * (double)local_478 +
                 (double)local_4a8[1] * (double)_uStack_480 * (double)local_518._0_8_) -
                (double)local_4a8[2] * (double)local_4a8[4] * (double)local_518._0_8_) -
               (double)local_528._8_8_ * (double)local_4a8[1] * (double)local_478) -
              (double)_uStack_480 * (double)local_4b8._M_pi * (double)local_4a8[3]) * 27.0) / 27.0)
             * 0.5;
    dVar39 = dVar44 * dVar44 * dVar44;
    dVar55 = dVar56 * dVar56 + dVar39;
    dVar53 = dVar53 / 3.0;
    local_278 = (Library *)local_4b8._M_pi;
    uStack_270 = (Library *)local_528._8_8_;
    local_288 = (Library *)local_518._0_8_;
    uStack_280 = local_4a8[1];
    local_298 = local_4a8[2];
    pLStack_290 = local_4a8[3];
    local_2a8 = local_4a8[4];
    pLStack_2a0 = _uStack_480;
    local_450 = local_478;
    local_1e8 = dVar35;
    if (0.0 <= dVar55) {
      pLVar36 = (Library *)SQRT(dVar55);
      local_4c8 = pLVar36;
      if (0.0 > dVar55) {
        pLVar36 = (Library *)sqrt(dVar55);
      }
      dVar35 = cbrt((double)pLVar36 + dVar56);
      pLVar36 = local_4c8;
      if (dVar55 < 0.0) {
        pLVar36 = (Library *)sqrt(dVar55);
      }
      dVar39 = cbrt(dVar56 - (double)pLVar36);
      local_268[0] = (Library *)(dVar53 + dVar35 + dVar39);
      pLVar36 = (Library *)((dVar35 + dVar39) * -0.5 + dVar53);
      local_268[2] = pLVar36;
    }
    else {
      if (-0.0 < dVar39) {
        dVar35 = sqrt(-dVar39);
      }
      else {
        dVar35 = SQRT(-dVar39);
      }
      dVar39 = -1.0;
      if (-1.0 <= dVar56 / dVar35) {
        dVar39 = dVar56 / dVar35;
      }
      dVar35 = 1.0;
      if (dVar39 <= 1.0) {
        dVar35 = dVar39;
      }
      dVar35 = acos(dVar35);
      if (-0.0 < dVar44) {
        dVar39 = sqrt(-dVar44);
      }
      else {
        dVar39 = SQRT(-dVar44);
      }
      dVar39 = dVar39 + dVar39;
      dVar55 = cos(dVar35 / 3.0);
      local_4c8 = (Library *)(dVar55 * dVar39 + dVar53);
      p_Stack_4c0 = extraout_XMM0_Qb;
      dVar55 = cos((dVar35 + 6.283185307179586) / 3.0);
      pLVar36 = (Library *)(dVar55 * dVar39 + dVar53);
      dVar35 = cos((dVar35 + -6.283185307179586) / 3.0);
      local_268[0] = local_4c8;
      local_268[2] = (Library *)(dVar35 * dVar39 + dVar53);
    }
    pLVar50 = local_268[0];
    pLVar37 = pLVar36;
    pLVar45 = local_268[2];
    if (((ABS((double)local_268[0] - (double)pLVar36) < 5e-05) ||
        (pLVar50 = local_268[2], pLVar37 = local_268[0], pLVar45 = pLVar36,
        ABS((double)local_268[0] - (double)local_268[2]) < 5e-05)) ||
       (pLVar37 = pLVar36, pLVar45 = local_268[0],
       ABS((double)pLVar36 - (double)local_268[2]) < 5e-05)) {
      pLVar36 = (Library *)(((double)pLVar37 + (double)pLVar50) * 0.5);
      if (5e-05 <= ABS((double)pLVar45 - (double)pLVar36)) {
        local_268[0] = pLVar45;
        local_268[1] = pLVar36;
        local_268[2] = pLVar50;
        pdVar14 = (double *)local_528;
        local_528._0_8_ = local_278;
        local_528._8_8_ = uStack_270;
        local_518._0_8_ = local_288;
        local_518._8_8_ = uStack_280;
        local_508[0] = local_298;
        local_508[1] = pLStack_290;
        local_508[2] = local_2a8;
        _Stack_4f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_2a0;
        local_4e8 = local_450;
        lVar22 = 0;
        do {
          *pdVar14 = *pdVar14 - (double)pLVar45;
          lVar22 = lVar22 + 0x18;
          pdVar14 = pdVar14 + 4;
        } while (lVar22 != 0x48);
        p_Var15 = &local_4b8;
        puVar20 = (undefined8 *)local_528;
        puVar23 = puVar20;
        p_Var26 = p_Var15;
        for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
          p_Var26->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar23;
          puVar23 = puVar23 + (ulong)bVar34 * -2 + 1;
          p_Var26 = p_Var26 + (ulong)bVar34 * -2 + 1;
        }
        lVar22 = 0;
        do {
          lVar28 = 0;
          p_Var26 = p_Var15;
          do {
            puVar20[lVar28] = p_Var26->_M_pi;
            uVar7 = local_518._0_8_;
            uVar6 = local_528._8_8_;
            uVar18 = local_528._0_8_;
            lVar28 = lVar28 + 1;
            p_Var26 = p_Var26 + 3;
          } while (lVar28 != 3);
          lVar22 = lVar22 + 1;
          puVar20 = puVar20 + 3;
          p_Var15 = p_Var15 + 1;
        } while (lVar22 != 3);
        local_4b8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((double)local_528._8_8_ * (double)local_508[1] -
             (double)local_508[0] * (double)local_518._0_8_);
        auStack_4b0 = (undefined1  [8])
                      ((double)local_518._0_8_ * (double)local_518._8_8_ -
                      (double)local_508[1] * (double)local_528._0_8_);
        dVar39 = -(double)local_528._8_8_;
        local_4a8[0] = (Library *)
                       ((double)local_528._0_8_ * (double)local_508[0] -
                       (double)local_518._8_8_ * (double)local_528._8_8_);
        local_448.write_.shared_alloc_.alloc = (Alloc *)local_4b8._M_pi;
        local_448.write_.shared_alloc_.direct_ptr = (void *)auStack_4b0;
        uStack_438._0_4_ = SUB84(local_4a8[0],0);
        uStack_438._4_4_ = (undefined4)((ulong)local_4a8[0] >> 0x20);
        dVar35 = (double)local_4b8._M_pi * (double)local_4b8._M_pi;
        lVar22 = 1;
        do {
          dVar35 = dVar35 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar22] *
                            *(double *)(auStack_4b0 + lVar22 * 8 + -8);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        local_e8 = pLVar45;
        local_4c8 = (Library *)(local_518._0_8_ ^ 0x8000000000000000);
        p_Stack_4c0 = (_Base_ptr)(local_528._0_8_ ^ 0x8000000000000000);
        local_2b8 = (Library *)local_4b8._M_pi;
        pLStack_2b0 = (Library *)auStack_4b0;
        local_1d8 = local_4a8[0];
        uStack_1d0 = 0;
        if (dVar35 < 0.0) {
          local_3f8 = (Library *)local_518._8_8_;
          pLStack_3f0 = (Library *)0x0;
          local_398 = local_508[0];
          pLStack_390 = local_508[1];
          local_2c8 = local_508[1];
          pLStack_2c0 = (Library *)local_518._8_8_;
          uStack_438 = local_4a8[0];
          pLVar45 = (Library *)sqrt(dVar35);
          pLVar50 = local_3f8;
          pLVar37 = pLStack_3f0;
          uVar57 = extraout_XMM0_Qb_00;
          pLVar49 = local_398;
          pLVar54 = pLStack_390;
          pLVar52 = local_2c8;
          pLVar51 = pLStack_2c0;
        }
        else {
          pLVar45 = (Library *)SQRT(dVar35);
          uVar57 = 0;
          pLVar50 = (Library *)local_518._8_8_;
          pLVar37 = (Library *)0x0;
          pLVar49 = local_508[0];
          pLVar54 = local_508[1];
          pLVar52 = local_508[1];
          pLVar51 = (Library *)local_518._8_8_;
        }
        local_4b8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((double)pLVar49 * (double)local_4e8 - (double)pLVar52 * (double)_Stack_4f0._M_pi);
        auStack_4b0 = (undefined1  [8])
                      ((double)pLVar54 * (double)local_508[2] - (double)pLVar51 * (double)local_4e8)
        ;
        local_4a8[0] = (Library *)
                       ((double)pLVar50 * (double)_Stack_4f0._M_pi -
                       (double)pLVar49 * (double)local_508[2]);
        local_448.write_.shared_alloc_.alloc = (Alloc *)local_4b8._M_pi;
        local_448.write_.shared_alloc_.direct_ptr = (void *)auStack_4b0;
        uStack_438._0_4_ = SUB84(local_4a8[0],0);
        uStack_438._4_4_ = (undefined4)((ulong)local_4a8[0] >> 0x20);
        dVar35 = (double)local_4b8._M_pi * (double)local_4b8._M_pi;
        lVar22 = 1;
        do {
          dVar35 = dVar35 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar22] *
                            *(double *)(auStack_4b0 + lVar22 * 8 + -8);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        if (dVar35 < 0.0) {
          local_2c8 = local_508[2];
          pLStack_2c0 = (Library *)0x0;
          local_f8 = (Library *)_Stack_4f0._M_pi;
          pLStack_f0 = local_4e8;
          local_2d8 = local_4e8;
          pLStack_2d0 = local_508[2];
          local_3f8 = local_4a8[0];
          pLStack_3f0 = pLVar37;
          local_398 = (Library *)local_4b8._M_pi;
          pLStack_390 = (Library *)auStack_4b0;
          local_108 = pLVar45;
          uStack_438 = local_4a8[0];
          pLVar52 = (Library *)sqrt(dVar35);
          uVar57 = 0;
          uVar41 = (undefined4)local_2c8;
          uVar42 = local_2c8._4_4_;
          local_4a8[0] = local_3f8;
          pLVar37 = pLStack_3f0;
          local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398;
          auStack_4b0 = (undefined1  [8])pLStack_390;
          pLVar45 = local_108;
          _Var43._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8;
          pLVar50 = pLStack_f0;
          pLVar49 = local_2d8;
          pLVar54 = pLStack_2d0;
        }
        else {
          pLVar52 = (Library *)SQRT(dVar35);
          uVar41 = (int)local_508[2];
          uVar42 = (int)((ulong)local_508[2] >> 0x20);
          _Var43._M_pi = _Stack_4f0._M_pi;
          pLVar50 = local_4e8;
          pLVar49 = local_4e8;
          pLVar54 = local_508[2];
        }
        pLVar40 = (Library *)
                  (~-(ulong)((double)pLVar45 < (double)pLVar52) & (ulong)local_1d8 |
                  (ulong)local_4a8[0] & -(ulong)((double)pLVar45 < (double)pLVar52));
        pLVar51 = (Library *)auStack_4b0;
        pLVar38 = (Library *)local_4b8._M_pi;
        if ((double)pLVar52 <= (double)pLVar45) {
          pLVar52 = pLVar45;
          pLVar51 = pLStack_2b0;
          pLVar38 = local_2b8;
        }
        pLVar45 = (Library *)
                  ((double)uVar6 * (double)pLVar49 + (double)_Var43._M_pi * (double)local_4c8);
        pLVar50 = (Library *)
                  ((double)uVar7 * (double)pLVar54 + (double)pLVar50 * (double)p_Stack_4c0);
        pLVar49 = (Library *)
                  ((double)uVar18 * (double)_Var43._M_pi + (double)CONCAT44(uVar42,uVar41) * dVar39)
        ;
        local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar45;
        auStack_4b0 = (undefined1  [8])pLVar50;
        local_4a8[0] = pLVar49;
        local_448.write_.shared_alloc_.alloc = (Alloc *)pLVar45;
        local_448.write_.shared_alloc_.direct_ptr = pLVar50;
        uStack_438._0_4_ = SUB84(pLVar49,0);
        uStack_438._4_4_ = (undefined4)((ulong)pLVar49 >> 0x20);
        dVar35 = (double)pLVar45 * (double)pLVar45;
        lVar22 = 1;
        do {
          dVar35 = dVar35 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar22] *
                            *(double *)(auStack_4b0 + lVar22 * 8 + -8);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        uStack_438 = pLVar49;
        if (dVar35 < 0.0) {
          local_4c8 = pLVar40;
          p_Stack_4c0 = (_Base_ptr)(~uVar57 & uStack_1d0 | (ulong)pLVar37 & uVar57);
          local_398 = pLVar38;
          pLStack_390 = pLVar51;
          pLVar37 = (Library *)sqrt(dVar35);
          pLVar38 = local_398;
          pLVar51 = pLStack_390;
          pLVar40 = local_4c8;
        }
        else {
          pLVar37 = (Library *)SQRT(dVar35);
        }
        pLVar54 = pLVar37;
        if ((double)pLVar37 <= (double)pLVar52) {
          pLVar45 = pLVar38;
          pLVar50 = pLVar51;
          pLVar54 = pLVar52;
        }
        if ((double)pLVar54 <= 1e-10) {
          uVar18 = 0xbf;
          local_2d8 = (Library *)0x44960d;
LAB_002e68a1:
          fail("assertion %s failed at %s +%d\n",local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
               ,uVar18);
        }
        local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar45;
        local_4a8[0] = (Library *)
                       (~-(ulong)((double)pLVar52 < (double)pLVar37) & (ulong)pLVar40 |
                       (ulong)pLVar49 & -(ulong)((double)pLVar52 < (double)pLVar37));
        auStack_4b0 = (undefined1  [8])pLVar50;
        lVar22 = 0;
        do {
          (&local_448.write_.shared_alloc_.alloc)[lVar22] =
               (Alloc *)(*(double *)(auStack_4b0 + lVar22 * 8 + -8) / (double)pLVar54);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        local_3e8.shared_alloc_.alloc = local_448.write_.shared_alloc_.alloc;
        local_3e8.shared_alloc_.direct_ptr = local_448.write_.shared_alloc_.direct_ptr;
        local_3d8[0] = uStack_438;
        local_548[0] = local_e8;
        local_448.write_.shared_alloc_.alloc = (Alloc *)local_278;
        local_448.write_.shared_alloc_.direct_ptr = uStack_270;
        uStack_438._0_4_ = (undefined4)local_288;
        uStack_438._4_4_ = local_288._4_4_;
        uStack_430 = (undefined4)uStack_280;
        uStack_42c = uStack_280._4_4_;
        local_428 = local_298;
        pLStack_420 = pLStack_290;
        local_418 = local_2a8;
        pLStack_410 = pLStack_2a0;
        local_408 = local_450;
        lVar22 = 0;
        do {
          (a->write_).shared_alloc_.alloc =
               (Alloc *)((double)(a->write_).shared_alloc_.alloc - (double)pLVar36);
          lVar22 = lVar22 + 0x18;
          a = a + 2;
        } while (lVar22 != 0x48);
        puVar13 = local_528;
        ppvVar17 = (void **)&local_448;
        lVar22 = 0;
        do {
          lVar28 = 0;
          ppvVar24 = ppvVar17;
          do {
            *(void **)(puVar13 + lVar28 * 8) = *ppvVar24;
            lVar28 = lVar28 + 1;
            ppvVar24 = ppvVar24 + 3;
          } while (lVar28 != 3);
          lVar22 = lVar22 + 1;
          puVar13 = puVar13 + 0x18;
          ppvVar17 = ppvVar17 + 1;
        } while (lVar22 != 3);
        local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._0_8_;
        auStack_4b0 = (undefined1  [8])local_528._8_8_;
        local_4a8[0] = (Library *)local_518._0_8_;
        local_378 = (Library *)local_528._0_8_;
        pvStack_370 = (void *)local_528._8_8_;
        local_368 = (Library *)local_518._0_8_;
        dVar35 = (double)local_528._0_8_ * (double)local_528._0_8_;
        lVar22 = 1;
        do {
          dVar35 = dVar35 + (double)(&local_378)[lVar22] *
                            *(double *)(auStack_4b0 + lVar22 * 8 + -8);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        if (dVar35 < 0.0) {
          dVar35 = sqrt(dVar35);
        }
        else {
          dVar35 = SQRT(dVar35);
        }
        uVar57 = 0;
        uVar31 = 1;
        do {
          local_4a8[0] = *(Library **)(local_518 + uVar31 * 0x18);
          local_4b8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               *(Library **)(local_528 + uVar31 * 0x18);
          auStack_4b0 = (undefined1  [8])*(Library **)(local_518 + uVar31 * 0x18 + -8);
          local_378 = *(Library **)(local_528 + uVar31 * 0x18);
          pvStack_370 = *(void **)(local_518 + uVar31 * 0x18 + -8);
          local_368 = *(Library **)(local_518 + uVar31 * 0x18);
          dVar39 = (double)*(Library **)(local_528 + uVar31 * 0x18) *
                   (double)*(Library **)(local_528 + uVar31 * 0x18);
          lVar22 = 1;
          do {
            dVar39 = dVar39 + (double)(&local_378)[lVar22] *
                              *(double *)(auStack_4b0 + lVar22 * 8 + -8);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          if (dVar39 < 0.0) {
            dVar39 = sqrt(dVar39);
          }
          else {
            dVar39 = SQRT(dVar39);
          }
          if (dVar35 < dVar39) {
            uVar57 = uVar31 & 0xffffffff;
            dVar35 = dVar39;
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != 3);
        if (dVar35 <= 1e-10) {
          uVar18 = 0xd3;
          local_2d8 = (Library *)0x44961e;
          goto LAB_002e68a1;
        }
        local_4a8[0] = (Library *)*(undefined8 *)(local_518 + (long)(int)uVar57 * 0x18);
        lVar22 = (long)(int)uVar57 * 0x18;
        local_4b8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(Library **)(local_528 + lVar22);
        auStack_4b0 = (undefined1  [8])*(undefined8 *)(local_518 + lVar22 + -8);
        lVar22 = 0;
        do {
          (&local_378)[lVar22] = (Library *)(*(double *)(auStack_4b0 + lVar22 * 8 + -8) / dVar35);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        dVar35 = (double)((ulong)local_368 & 0x8000000000000000 | (ulong)DAT_00449120);
        dVar39 = -1.0 / ((double)local_368 + dVar35);
        local_3b8 = (Library *)((double)local_378 * (double)pvStack_370 * dVar39);
        local_3d8[1] = (Library *)((double)local_378 * dVar35 * (double)local_378 * dVar39 + 1.0);
        local_3c8 = (double)local_3b8 * dVar35;
        pLStack_3c0 = (Library *)(-dVar35 * (double)local_378);
        local_3b0 = (Alloc *)((double)pvStack_370 * (double)pvStack_370 * dVar39 + dVar35);
        local_3a8 = (void *)((ulong)pvStack_370 ^ 0x8000000000000000);
        local_548[2] = pLVar36;
        local_548[1] = pLVar36;
      }
      else {
        local_548[2] = (Library *)
                       ((double)pLVar45 * 0.3333333333333333 + (double)pLVar36 * 0.6666666666666666)
        ;
        local_548[1] = local_548[2];
        local_548[0] = local_548[2];
        puVar13 = local_528 + 8;
        lVar22 = 0;
        lVar28 = 0;
        do {
          lVar29 = 0;
          auVar47 = _DAT_00443a30;
          do {
            bVar48 = SUB164(auVar47 ^ _DAT_00443a40,4) == -0x80000000 &&
                     SUB164(auVar47 ^ _DAT_00443a40,0) < -0x7ffffffd;
            if (bVar48) {
              uVar18 = 0x3ff0000000000000;
              if (lVar22 != lVar29) {
                uVar18 = 0;
              }
              *(undefined8 *)(puVar13 + lVar29 + -8) = uVar18;
            }
            if (bVar48) {
              uVar18 = 0x3ff0000000000000;
              if (lVar22 + -8 != lVar29) {
                uVar18 = 0;
              }
              *(undefined8 *)(puVar13 + lVar29) = uVar18;
            }
            lVar30 = auVar47._8_8_;
            auVar47._0_8_ = auVar47._0_8_ + 2;
            auVar47._8_8_ = lVar30 + 2;
            lVar29 = lVar29 + 0x10;
          } while (lVar29 != 0x20);
          lVar28 = lVar28 + 1;
          lVar22 = lVar22 + 8;
          puVar13 = puVar13 + 0x18;
        } while (lVar28 != 3);
        lVar22 = 9;
        puVar20 = (undefined8 *)local_528;
        pSVar25 = &local_3e8.shared_alloc_;
        for (; lVar22 != 0; lVar22 = lVar22 + -1) {
          pSVar25->alloc = *puVar20;
          puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
          pSVar25 = (SharedAlloc *)((long)pSVar25 + ((ulong)bVar34 * 0xfffffffffffffffe + 1) * 8);
        }
      }
      local_548[1] = local_548[2];
    }
    else {
      local_268[1] = pLVar36;
      lVar22 = 0;
      local_2d8 = (Library *)0x44960d;
      do {
        pLVar36 = local_268[lVar22];
        local_528._4_4_ = local_278._4_4_;
        local_528._0_4_ = (undefined4)local_278;
        local_528._12_4_ = uStack_270._4_4_;
        local_528._8_4_ = (undefined4)uStack_270;
        local_518._0_8_ = local_288;
        local_518._8_8_ = uStack_280;
        local_508[0] = local_298;
        local_508[1] = pLStack_290;
        local_508[2] = local_2a8;
        _Stack_4f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_2a0;
        local_4e8 = local_450;
        lVar28 = 0;
        pdVar14 = (double *)local_528;
        do {
          *pdVar14 = *pdVar14 - (double)pLVar36;
          lVar28 = lVar28 + 0x18;
          pdVar14 = pdVar14 + 4;
        } while (lVar28 != 0x48);
        pdVar14 = (double *)local_528;
        p_Var27 = (__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)&local_4b8;
        for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
          ((__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)
          &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)p_Var27)->_M_pi)->_M_ptr =
               (element_type *)*pdVar14;
          pdVar14 = pdVar14 + (ulong)bVar34 * -2 + 1;
          p_Var27 = (__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)
                    ((long)p_Var27 + ((ulong)bVar34 * 0xfffffffffffffffe + 1) * 8);
        }
        lVar28 = 0;
        p_Var15 = &local_4b8;
        pdVar14 = (double *)local_528;
        do {
          lVar29 = 0;
          p_Var26 = p_Var15;
          do {
            pdVar14[lVar29] = (double)p_Var26->_M_pi;
            uVar8 = local_518._8_8_;
            uVar7 = local_518._0_8_;
            uVar6 = local_528._8_8_;
            uVar18 = local_528._0_8_;
            lVar29 = lVar29 + 1;
            p_Var26 = p_Var26 + 3;
          } while (lVar29 != 3);
          lVar28 = lVar28 + 1;
          pdVar14 = pdVar14 + 3;
          p_Var15 = p_Var15 + 1;
        } while (lVar28 != 3);
        dVar39 = -(double)local_518._0_8_;
        dVar55 = -(double)local_528._0_8_;
        local_e8 = (Library *)
                   ((double)local_528._8_8_ * (double)local_508[1] -
                   (double)local_508[0] * (double)local_518._0_8_);
        auStack_4b0 = (undefined1  [8])
                      ((double)local_518._0_8_ * (double)local_518._8_8_ -
                      (double)local_508[1] * (double)local_528._0_8_);
        local_4a8[0] = (Library *)
                       ((double)local_528._0_8_ * (double)local_508[0] -
                       (double)local_518._8_8_ * (double)local_528._8_8_);
        local_448.write_.shared_alloc_.direct_ptr = (void *)auStack_4b0;
        uStack_438._0_4_ = SUB84(local_4a8[0],0);
        uStack_438._4_4_ = (undefined4)((ulong)local_4a8[0] >> 0x20);
        dVar35 = (double)local_e8 * (double)local_e8;
        lVar28 = 1;
        do {
          dVar35 = dVar35 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar28] *
                            *(double *)(auStack_4b0 + lVar28 * 8 + -8);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        local_1d8 = pLVar36;
        local_4c8 = (Library *)(local_528._8_8_ ^ 0x8000000000000000);
        p_Stack_4c0 = (_Base_ptr)(local_518._0_8_ ^ 0x8000000000000000);
        pLStack_e0 = (Library *)auStack_4b0;
        local_398 = local_4a8[0];
        pLStack_390 = (Library *)0x0;
        if (dVar35 < 0.0) {
          local_3f8 = local_508[0];
          pLStack_3f0 = local_508[1];
          local_2b8 = local_508[1];
          pLStack_2b0 = (Library *)local_518._8_8_;
          uStack_438 = local_4a8[0];
          pLVar36 = (Library *)sqrt(dVar35);
          pLVar50 = local_3f8;
          pLVar37 = pLStack_3f0;
          pLVar45 = local_2b8;
          pLVar49 = pLStack_2b0;
        }
        else {
          pLVar36 = (Library *)SQRT(dVar35);
          pLVar50 = local_508[0];
          pLVar37 = local_508[1];
          pLVar45 = local_508[1];
          pLVar49 = (Library *)local_518._8_8_;
        }
        pLVar45 = (Library *)
                  ((double)pLVar50 * (double)local_4e8 - (double)pLVar45 * (double)_Stack_4f0._M_pi)
        ;
        auStack_4b0 = (undefined1  [8])
                      ((double)pLVar37 * (double)local_508[2] - (double)pLVar49 * (double)local_4e8)
        ;
        dVar44 = (double)uVar8 * (double)_Stack_4f0._M_pi - (double)pLVar50 * (double)local_508[2];
        local_4a8[0] = (Library *)dVar44;
        local_448.write_.shared_alloc_.direct_ptr = (void *)auStack_4b0;
        uStack_438._0_4_ = SUB84(dVar44,0);
        uStack_438._4_4_ = (undefined4)((ulong)dVar44 >> 0x20);
        dVar35 = (double)pLVar45 * (double)pLVar45;
        lVar28 = 1;
        do {
          dVar35 = dVar35 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar28] *
                            *(double *)(auStack_4b0 + lVar28 * 8 + -8);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        if (dVar35 < 0.0) {
          local_2b8 = local_508[2];
          pLStack_2b0 = (Library *)0x0;
          local_2c8 = (Library *)_Stack_4f0._M_pi;
          pLStack_2c0 = local_4e8;
          local_108 = local_4e8;
          pLStack_100 = local_508[2];
          local_3f8 = pLVar45;
          pLStack_3f0 = (Library *)auStack_4b0;
          local_f8 = pLVar36;
          uStack_438 = (Library *)dVar44;
          pLVar54 = (Library *)sqrt(dVar35);
          uVar41 = (undefined4)local_2b8;
          uVar42 = local_2b8._4_4_;
          pLVar36 = local_f8;
          _Var43._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8;
          pLVar50 = pLStack_2c0;
          pLVar37 = local_108;
          pLVar49 = pLStack_100;
          pLVar45 = local_3f8;
          auStack_4b0 = (undefined1  [8])pLStack_3f0;
        }
        else {
          pLVar54 = (Library *)SQRT(dVar35);
          uVar41 = (int)local_508[2];
          uVar42 = (int)((ulong)local_508[2] >> 0x20);
          _Var43._M_pi = _Stack_4f0._M_pi;
          pLVar50 = local_4e8;
          pLVar37 = local_4e8;
          pLVar49 = local_508[2];
        }
        pLVar52 = (Library *)auStack_4b0;
        if ((double)pLVar54 <= (double)pLVar36) {
          pLVar45 = local_e8;
          pLVar52 = pLStack_e0;
        }
        uVar57 = ~-(ulong)((double)pLVar36 < (double)pLVar54) & (ulong)local_398;
        pLVar51 = pLVar54;
        if ((double)pLVar54 <= (double)pLVar36) {
          pLVar51 = pLVar36;
        }
        pLVar37 = (Library *)((double)uVar6 * (double)pLVar37 + (double)_Var43._M_pi * dVar39);
        pLVar50 = (Library *)((double)uVar7 * (double)pLVar49 + (double)pLVar50 * dVar55);
        pLVar49 = (Library *)
                  ((double)uVar18 * (double)_Var43._M_pi +
                  (double)CONCAT44(uVar42,uVar41) * (double)local_4c8);
        auStack_4b0 = (undefined1  [8])pLVar50;
        local_4a8[0] = pLVar49;
        local_448.write_.shared_alloc_.direct_ptr = pLVar50;
        uStack_438._0_4_ = SUB84(pLVar49,0);
        uStack_438._4_4_ = (undefined4)((ulong)pLVar49 >> 0x20);
        dVar35 = (double)pLVar37 * (double)pLVar37;
        lVar28 = 1;
        do {
          dVar35 = dVar35 + (double)(&local_448.write_.shared_alloc_.alloc)[lVar28] *
                            *(double *)(auStack_4b0 + lVar28 * 8 + -8);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        uStack_438 = pLVar49;
        if (dVar35 < 0.0) {
          local_3f8 = pLVar45;
          pLStack_3f0 = pLVar52;
          pLVar38 = (Library *)sqrt(dVar35);
          pLVar45 = local_3f8;
          pLVar52 = pLStack_3f0;
        }
        else {
          pLVar38 = (Library *)SQRT(dVar35);
        }
        pLVar40 = pLVar38;
        if ((double)pLVar38 <= (double)pLVar51) {
          pLVar40 = pLVar51;
          pLVar50 = pLVar52;
          pLVar37 = pLVar45;
        }
        if ((double)pLVar40 <= 1e-10) {
          uVar18 = 0xbf;
          goto LAB_002e68a1;
        }
        local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar37;
        local_4a8[0] = (Library *)
                       (~-(ulong)((double)pLVar51 < (double)pLVar38) &
                        (uVar57 | (ulong)dVar44 & -(ulong)((double)pLVar36 < (double)pLVar54)) |
                       (ulong)pLVar49 & -(ulong)((double)pLVar51 < (double)pLVar38));
        auStack_4b0 = (undefined1  [8])pLVar50;
        lVar28 = 0;
        do {
          (&local_448.write_.shared_alloc_.alloc)[lVar28] =
               (Alloc *)(*(double *)(auStack_4b0 + lVar28 * 8 + -8) / (double)pLVar40);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        *(Alloc **)((long)&local_3e8 + lVar22 * 0x18) = local_448.write_.shared_alloc_.alloc;
        local_3d8[lVar22 * 3 + -1] = (Library *)local_448.write_.shared_alloc_.direct_ptr;
        local_3d8[lVar22 * 3] = uStack_438;
        local_548[lVar22] = local_1d8;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
    }
    dVar35 = local_1e8;
    lVar22 = 9;
    pSVar25 = &local_3e8.shared_alloc_;
    puVar20 = (undefined8 *)local_528;
    for (; lVar22 != 0; lVar22 = lVar22 + -1) {
      *puVar20 = pSVar25->alloc;
      pSVar25 = (SharedAlloc *)((long)pSVar25 + ((ulong)bVar34 * 0xfffffffffffffffe + 1) * 8);
      puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
    }
    local_4d0 = local_548[2];
    local_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548[0];
    pLStack_4d8 = local_548[1];
    puVar20 = (undefined8 *)local_528;
    p_Var15 = &local_4b8;
    for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
      p_Var15->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar20;
      puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
      p_Var15 = p_Var15 + (ulong)bVar34 * -2 + 1;
    }
    local_3d8[0] = local_548[2];
    local_3e8.shared_alloc_.alloc = (Alloc *)local_548[0];
    local_3e8.shared_alloc_.direct_ptr = local_548[1];
    lVar22 = 0;
    do {
      *(double *)(local_470 + lVar22 * 8) =
           (double)(&local_3e8.shared_alloc_.alloc)[lVar22] * dVar35;
      lVar22 = lVar22 + 1;
      pCVar32 = local_380;
    } while (lVar22 != 3);
  }
  local_268[2] = (Library *)local_460;
  local_268[0] = (Library *)local_470._0_8_;
  local_268[1] = (Library *)local_470._8_8_;
  p_Var15 = &local_4b8;
  puVar20 = (undefined8 *)local_528;
  for (lVar22 = 9; pAVar9 = local_328, lVar22 != 0; lVar22 = lVar22 + -1) {
    *puVar20 = p_Var15->_M_pi;
    p_Var15 = p_Var15 + (ulong)bVar34 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar34 * -2 + 1;
  }
  iVar16 = 0;
  lVar22 = 1;
  do {
    iVar12 = (int)lVar22;
    if ((double)local_268[iVar16] < (double)local_268[lVar22] ||
        (double)local_268[iVar16] == (double)local_268[lVar22]) {
      iVar12 = iVar16;
    }
    iVar16 = iVar12;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  lVar22 = (long)iVar16 * 0x18;
  pdVar14 = (double *)(local_528 + lVar22);
  local_368 = (Library *)*(undefined8 *)(local_518 + lVar22);
  local_378 = (Library *)*pdVar14;
  pvStack_370 = (void *)*(undefined8 *)(local_518 + lVar22 + -8);
  lVar28 = 0;
  uVar19 = 0;
  do {
    uVar19 = uVar19 | (uint)(0.0 <= (double)(&local_378)[lVar28]) << ((byte)lVar28 & 0x1f);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 3);
  if (uVar19 < (~uVar19 & 7)) {
    local_3d8[0] = *(Library **)(local_518 + lVar22);
    local_3e8.shared_alloc_.alloc = (Alloc *)*pdVar14;
    local_3e8.shared_alloc_.direct_ptr = *(Library **)(local_518 + lVar22 + -8);
    lVar22 = 0;
    do {
      local_98[lVar22] = -(double)(&local_3e8.shared_alloc_.alloc)[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
  }
  else {
    local_98[2] = *(double *)(local_518 + lVar22);
    local_98[0] = *pdVar14;
    local_98[1] = *(double *)(local_518 + lVar22 + -8);
  }
  (pVVar10->super_Few<double,_3>).array_[2] = local_98[2];
  (pVVar10->super_Few<double,_3>).array_[0] = local_98[0];
  (pVVar10->super_Few<double,_3>).array_[1] = local_98[1];
  if (((ulong)local_328 & 7) == 0 && local_328 != (Alloc *)0x0) {
    piVar1 = &local_328->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_328);
      operator_delete(pAVar9,0x48);
    }
  }
  pLVar36 = local_318;
  if (((ulong)local_318 & 7) == 0 && local_318 != (Library *)0x0) {
    pCVar2 = &local_318->self_;
    *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         -1;
    if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 0
       ) {
      Alloc::~Alloc((Alloc *)local_318);
      operator_delete(pLVar36,0x48);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_1b8.write_.shared_alloc_.alloc =
       (Alloc *)(pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1b8.write_.shared_alloc_.direct_ptr =
       (pCVar32->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8.write_.shared_alloc_.direct_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8.write_.shared_alloc_.direct_ptr)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_1b8.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8.write_.shared_alloc_.direct_ptr)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_1b8.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
    }
  }
  local_1c8.write_.shared_alloc_.alloc = (local_218->write_).shared_alloc_.alloc;
  if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1c8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1c8.write_.shared_alloc_.alloc)->use_count =
           (local_1c8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar9 = local_1c8.write_.shared_alloc_.alloc;
  local_1c8.write_.shared_alloc_.direct_ptr = (local_218->write_).shared_alloc_.direct_ptr;
  local_b8 = (pRVar11->write_).shared_alloc_.alloc;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  this_01 = local_b8;
  local_b0 = (pRVar11->write_).shared_alloc_.direct_ptr;
  center_00.super_Few<double,_3>.array_[1] = local_80.super_Few<double,_3>.array_[1];
  center_00.super_Few<double,_3>.array_[0] = local_80.super_Few<double,_3>.array_[0];
  center_00.super_Few<double,_3>.array_[2] = local_80.super_Few<double,_3>.array_[2];
  RVar58 = anon_unknown_0::mark_bisection_internal
                     ((CommPtr *)pAVar3,&local_1b8,&local_1c8,local_d0,
                      (Few<double,_3>)*(Few<double,_3> *)(pVVar10->super_Few<double,_3>).array_,
                      center_00,local_210);
  pvVar21 = RVar58.write_.shared_alloc_.direct_ptr;
  if (((ulong)this_01 & 7) == 0 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
      pvVar21 = extraout_RDX;
    }
  }
  if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
    piVar1 = &pAVar9->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar9);
      operator_delete(pAVar9,0x48);
      pvVar21 = extraout_RDX_00;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8.write_.shared_alloc_.direct_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1b8.write_.shared_alloc_.direct_ptr);
    pvVar21 = extraout_RDX_01;
  }
  RVar58.write_.shared_alloc_.direct_ptr = pvVar21;
  RVar58.write_.shared_alloc_.alloc = pAVar3;
  return (Read<signed_char>)RVar58.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_bisection(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3>& axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  axis = get_axis(comm, coords, masses, center);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}